

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O2

void gen_mfvsrwz(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 ret;
  TCGv_i64 dst;
  uintptr_t o;
  uintptr_t o_1;
  uint32_t uStack_30;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  if ((ctx->opcode & 1) == 0) {
    if (ctx->fpu_enabled != false) {
LAB_00a140f2:
      ret = tcg_temp_new_i64(tcg_ctx);
      dst = tcg_temp_new_i64(tcg_ctx);
      get_cpu_vsrh(tcg_ctx,dst,ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5);
      tcg_gen_ext32u_i64_ppc64(tcg_ctx,ret,dst);
      tcg_gen_mov_i64_ppc64(tcg_ctx,cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f],ret);
      tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
      tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(dst + (long)tcg_ctx));
      return;
    }
    uStack_30 = 7;
  }
  else {
    if (ctx->altivec_enabled != false) goto LAB_00a140f2;
    uStack_30 = 0x49;
  }
  gen_exception(ctx,uStack_30);
  return;
}

Assistant:

static void gen_mfvsrwz(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (xS(ctx->opcode) < 32) {
        if (unlikely(!ctx->fpu_enabled)) {
            gen_exception(ctx, POWERPC_EXCP_FPU);
            return;
        }
    } else {
        if (unlikely(!ctx->altivec_enabled)) {
            gen_exception(ctx, POWERPC_EXCP_VPU);
            return;
        }
    }
    TCGv_i64 tmp = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 xsh = tcg_temp_new_i64(tcg_ctx);
    get_cpu_vsrh(tcg_ctx, xsh, xS(ctx->opcode));
    tcg_gen_ext32u_i64(tcg_ctx, tmp, xsh);
    tcg_gen_trunc_i64_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], tmp);
    tcg_temp_free_i64(tcg_ctx, tmp);
    tcg_temp_free_i64(tcg_ctx, xsh);
}